

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O0

Path * tinyusdz::pathutil::FromString(Path *__return_storage_ptr__,string *_path_str)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 local_d8 [8];
  string prop_part;
  string prim_part;
  string local_90;
  allocator local_69;
  string local_68;
  ulong local_48;
  size_t loc;
  undefined1 local_38 [8];
  string path_str;
  string *_path_str_local;
  
  path_str.field_2._8_8_ = _path_str;
  ::std::__cxx11::string::string((string *)local_38,(string *)_path_str);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,".");
    if (bVar1) {
      Path::Path(__return_storage_ptr__);
      loc._4_4_ = 1;
    }
    else {
      uVar2 = ::std::__cxx11::string::find_last_of(local_38,0x594db7);
      local_48 = uVar2;
      if (uVar2 != 0xffffffffffffffff) {
        lVar3 = ::std::__cxx11::string::size();
        if (uVar2 == lVar3 - 1U) {
          Path::Path(__return_storage_ptr__);
          loc._4_4_ = 1;
          goto LAB_00281658;
        }
        uVar4 = ::std::__cxx11::string::size();
        uVar2 = local_48;
        if (((1 < uVar4) && (lVar3 = ::std::__cxx11::string::size(), uVar2 < lVar3 - 1U)) &&
           (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_38), *pcVar5 == '/')) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_68,"",&local_69);
          Path::Path(__return_storage_ptr__,(string *)local_38,&local_68);
          ::std::__cxx11::string::~string((string *)&local_68);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
          loc._4_4_ = 1;
          goto LAB_00281658;
        }
      }
      if (local_48 == 0xffffffffffffffff) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_90,"",(allocator *)(prim_part.field_2._M_local_buf + 0xf));
        Path::Path(__return_storage_ptr__,(string *)local_38,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)(prim_part.field_2._M_local_buf + 0xf));
        loc._4_4_ = 1;
      }
      else {
        ::std::__cxx11::string::substr((ulong)((long)&prop_part.field_2 + 8),(ulong)local_38);
        ::std::__cxx11::string::substr((ulong)local_d8,(ulong)local_38);
        Path::Path(__return_storage_ptr__,(string *)((long)&prop_part.field_2 + 8),
                   (string *)local_d8);
        loc._4_4_ = 1;
        ::std::__cxx11::string::~string((string *)local_d8);
        ::std::__cxx11::string::~string((string *)(prop_part.field_2._M_local_buf + 8));
      }
    }
  }
  else {
    Path::Path(__return_storage_ptr__);
    loc._4_4_ = 1;
  }
LAB_00281658:
  ::std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Path FromString(const std::string &_path_str) {

  std::string path_str = _path_str;

  if (path_str.empty()) {
    return Path();
  }

  if (path_str == ".") {
    // invalid
    return Path();
  }

  size_t loc = path_str.find_last_of(".");
  if (loc != std::string::npos) {
    if (loc == (path_str.size() - 1)) {
      // ends with "."
      return Path();
    } else if ((path_str.size() > 1) && (loc < (path_str.size() - 1))) {
      if (path_str[loc+1] == '/') {
        // guess relative prim path only.
        return Path(path_str, "");
      }
    }
  }

  if (loc == std::string::npos) {
    // prim_part only
    return Path(path_str, "");
  }

  std::string prim_part = path_str.substr(0, loc);
  std::string prop_part = path_str.substr(loc+1);

  return Path(prim_part, prop_part);
}